

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall HighsDomain::ConflictSet::ConflictSet(ConflictSet *this,HighsDomain *localdom_)

{
  _Rb_tree_header *p_Var1;
  
  this->localdom = localdom_;
  this->globaldom =
       &((localdom_->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain;
  p_Var1 = &(this->reasonSideFrontier)._M_t._M_impl.super__Rb_tree_header;
  (this->reasonSideFrontier)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->reasonSideFrontier)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->reasonSideFrontier)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->reasonSideFrontier)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->reasonSideFrontier)._M_t._M_impl = 0;
  *(undefined8 *)&(this->reasonSideFrontier)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->reasonSideFrontier)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->reasonSideFrontier)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->reconvergenceFrontier)._M_t._M_impl.super__Rb_tree_header;
  (this->reconvergenceFrontier)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  (this->reconvergenceFrontier)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this->reconvergenceFrontier)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->reconvergenceFrontier)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->reasonSideFrontier)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->reconvergenceFrontier)._M_t._M_impl = 0;
  (this->reconvergenceFrontier)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->reconvergenceFrontier)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->reconvergenceFrontier)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->resolveQueue).
  super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->resolveQueue).
  super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->resolveQueue).
  super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->resolvedDomainChanges).
  super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->resolvedDomainChanges).
  super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->resolvedDomainChanges).
  super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->resolveBuffer).
  super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->resolveBuffer).
  super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->resolveBuffer).
  super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

HighsDomain::ConflictSet::ConflictSet(HighsDomain& localdom_)
    : localdom(localdom_),
      globaldom(localdom.mipsolver->mipdata_->domain),
      reasonSideFrontier(),
      reconvergenceFrontier(),
      resolveQueue(),
      resolvedDomainChanges() {}